

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O3

void __thiscall testing::internal::UnitTestImpl::ConfigureStreamingOutput(UnitTestImpl *this)

{
  long lVar1;
  StreamingListener *this_00;
  ostream *poVar2;
  string local_60;
  string local_40;
  
  if (DAT_00150cc8 != 0) {
    lVar1 = std::__cxx11::string::find(-0x40,0x3a);
    if (lVar1 == -1) {
      GTestLog::GTestLog((GTestLog *)&local_60,GTEST_WARNING,
                         "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]Adiak/blt/thirdparty_builtin/googletest-master-2020-01-07/googletest/src/gtest.cc"
                         ,0x1476);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)&std::cerr,"unrecognized streaming target \"",0x1f);
      poVar2 = std::__ostream_insert<char,std::char_traits<char>>
                         ((ostream *)&std::cerr,FLAGS_gtest_stream_result_to_abi_cxx11_,DAT_00150cc8
                         );
      std::__ostream_insert<char,std::char_traits<char>>(poVar2,"\" ignored.",10);
      GTestLog::~GTestLog((GTestLog *)&local_60);
    }
    else {
      this_00 = (StreamingListener *)operator_new(0x10);
      std::__cxx11::string::substr((ulong)&local_60,0x150cc0);
      std::__cxx11::string::substr((ulong)&local_40,0x150cc0);
      StreamingListener::StreamingListener(this_00,&local_60,&local_40);
      TestEventRepeater::Append((this->listeners_).repeater_,(TestEventListener *)this_00);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_40._M_dataplus._M_p != &local_40.field_2) {
        operator_delete(local_40._M_dataplus._M_p);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_60._M_dataplus._M_p != &local_60.field_2) {
        operator_delete(local_60._M_dataplus._M_p);
      }
    }
  }
  return;
}

Assistant:

int UnitTestImpl::total_test_count() const {
  return SumOverTestSuiteList(test_suites_, &TestSuite::total_test_count);
}